

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Instr * __thiscall GlobOpt::TrackMarkTempObject(GlobOpt *this,Instr *instrStart,Instr *instrLast)

{
  Instr *pIVar1;
  BasicBlock *pBVar2;
  Opnd *this_00;
  Instr *pIVar3;
  bool bVar4;
  bool bVar5;
  RegOpnd *opnd;
  
  if (this->func->hasMarkTempObjects == true) {
    pIVar1 = instrLast->m_next;
    pBVar2 = this->currentBlock;
    pIVar3 = instrStart;
    do {
      instrLast = pIVar3;
      if (this->prePassLoop == (Loop *)0x0) {
        bVar4 = IR::Instr::HasAnyImplicitCalls(instrLast);
        if ((!bVar4) ||
           ((pBVar2->globOptData).maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0)
           ) goto LAB_00427ad9;
        bVar4 = true;
        if (instrLast->m_src1 != (Opnd *)0x0) {
          instrLast = GenerateBailOutMarkTempObjectIfNeeded(this,instrLast,instrLast->m_src1,false);
          if (instrLast->m_src2 != (Opnd *)0x0) {
            instrLast = GenerateBailOutMarkTempObjectIfNeeded
                                  (this,instrLast,instrLast->m_src2,false);
          }
        }
      }
      else {
LAB_00427ad9:
        bVar4 = false;
      }
      this_00 = instrLast->m_dst;
      if (this_00 != (Opnd *)0x0) {
        bVar5 = IR::Opnd::IsRegOpnd(this_00);
        if (bVar5) {
          opnd = IR::Opnd::AsRegOpnd(this_00);
          TrackTempObjectSyms(this,instrLast,opnd);
        }
        else if (bVar4) {
          instrLast = GenerateBailOutMarkTempObjectIfNeeded(this,instrLast,this_00,true);
        }
      }
      pIVar3 = instrLast->m_next;
    } while (instrLast->m_next != pIVar1);
  }
  return instrLast;
}

Assistant:

IR::Instr *
GlobOpt::TrackMarkTempObject(IR::Instr * instrStart, IR::Instr * instrLast)
{
    if (!this->func->GetHasMarkTempObjects())
    {
        return instrLast;
    }
    IR::Instr * instr = instrStart;
    IR::Instr * instrEnd = instrLast->m_next;
    IR::Instr * lastInstr = nullptr;
    GlobOptBlockData& globOptData = *CurrentBlockData();
    do
    {
        bool mayNeedBailOnImplicitCallsPreOp = !this->IsLoopPrePass()
            && instr->HasAnyImplicitCalls()
            && globOptData.maybeTempObjectSyms != nullptr;
        if (mayNeedBailOnImplicitCallsPreOp)
        {
            IR::Opnd * src1 = instr->GetSrc1();
            if (src1)
            {
                instr = GenerateBailOutMarkTempObjectIfNeeded(instr, src1, false);
                IR::Opnd * src2 = instr->GetSrc2();
                if (src2)
                {
                    instr = GenerateBailOutMarkTempObjectIfNeeded(instr, src2, false);
                }
            }
        }

        IR::Opnd *dst = instr->GetDst();
        if (dst)
        {
            if (dst->IsRegOpnd())
            {
                TrackTempObjectSyms(instr, dst->AsRegOpnd());
            }
            else if (mayNeedBailOnImplicitCallsPreOp)
            {
                instr = GenerateBailOutMarkTempObjectIfNeeded(instr, dst, true);
            }
        }

        lastInstr = instr;
        instr = instr->m_next;
    }
    while (instr != instrEnd);
    return lastInstr;
}